

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O0

size_t fl_strlcat(char *dst,char *src,size_t size)

{
  ulong uVar1;
  size_t dstlen;
  size_t srclen;
  size_t size_local;
  char *src_local;
  char *dst_local;
  
  dst_local = (char *)strlen(dst);
  uVar1 = size - (long)(dst_local + 1);
  if (uVar1 != 0) {
    dstlen = strlen(src);
    if (uVar1 < dstlen) {
      dstlen = uVar1;
    }
    memcpy(dst + (long)dst_local,src,dstlen);
    dst[(long)(dst_local + dstlen)] = '\0';
    dst_local = dst_local + dstlen;
  }
  return (size_t)dst_local;
}

Assistant:

size_t				/* O - Length of string */
fl_strlcat(char       *dst,	/* O - Destination string */
           const char *src,	/* I - Source string */
	   size_t     size) {	/* I - Size of destination string buffer */
  size_t	srclen;		/* Length of source string */
  size_t	dstlen;		/* Length of destination string */


 /*
  * Figure out how much room is left...
  */

  dstlen = strlen(dst);
  size   -= dstlen + 1;

  if (!size) return (dstlen);	/* No room, return immediately... */

 /*
  * Figure out how much room is needed...
  */

  srclen = strlen(src);

 /*
  * Copy the appropriate amount...
  */

  if (srclen > size) srclen = size;

  memcpy(dst + dstlen, src, srclen);
  dst[dstlen + srclen] = '\0';

  return (dstlen + srclen);
}